

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
FactoredDecPOMDPDiscrete::MarginalizeStateFactor
          (FactoredDecPOMDPDiscrete *this,Index sf,bool sparse)

{
  long *plVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  FactoredStateDistribution *old_isd;
  vector<unsigned_long,_std::allocator<unsigned_long>_> old_factor_sizes;
  undefined4 in_stack_000000e8;
  Index in_stack_000000ec;
  FactoredDecPOMDPDiscrete *in_stack_000000f0;
  Index in_stack_000000fc;
  FactoredDecPOMDPDiscrete *in_stack_00000100;
  undefined1 in_stack_0000046b;
  Index in_stack_0000046c;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_00000470;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  
  __x = in_RDI;
  (*(code *)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[0x17])();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(unaff_retaddr,__x);
  plVar1 = (long *)(*(code *)(in_RDI->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start[0x1a])();
  ClipRewardModel(in_stack_000000f0,in_stack_000000ec,in_stack_000000e8._3_1_);
  MultiAgentDecisionProcessDiscreteFactoredStates::MarginalizeTransitionObservationModel
            (in_stack_00000470,in_stack_0000046c,(bool)in_stack_0000046b);
  MarginalizeISD(in_stack_00000100,in_stack_000000fc,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_000000f0,
                 (FactoredStateDistribution *)CONCAT44(in_stack_000000ec,in_stack_000000e8));
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::MarginalizeStateFactor(Index sf, bool sparse)
{
    vector<size_t> old_factor_sizes = GetNrValuesPerFactor();
    const FactoredStateDistribution* old_isd = GetFactoredISD();

    ClipRewardModel(sf, sparse);
    MarginalizeTransitionObservationModel(sf, sparse);
    MarginalizeISD(sf, old_factor_sizes, old_isd);

    delete(old_isd);
}